

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall
Js::ProbeContainer::RegisterContextToDiag
          (ProbeContainer *this,DWORD_PTR context,ArenaAllocator *alloc)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  
  bVar3 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode(this->pScriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d0,
                                "(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode())"
                                ,"this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode()"
                               );
    if (!bVar3) goto LAB_008c8a11;
    *puVar4 = 0;
  }
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d1,"(alloc)","alloc");
    if (!bVar3) {
LAB_008c8a11:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = this->registeredFuncContextList;
  if (this_00 ==
      (List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    this_00 = (List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
         alloc;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4d88;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    this_00->length = 0;
    this_00->increment = 4;
    this->registeredFuncContextList = this_00;
  }
  JsUtil::List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_00,0);
  iVar1 = (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).
          count;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).buffer
  [iVar1] = context;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).count =
       iVar1 + 1;
  return;
}

Assistant:

void ProbeContainer::RegisterContextToDiag(DWORD_PTR context, ArenaAllocator *alloc)
    {
        Assert(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode());
        Assert(alloc);

        if (registeredFuncContextList == nullptr)
        {
            registeredFuncContextList = JsUtil::List<DWORD_PTR, ArenaAllocator>::New(alloc);
        }

        registeredFuncContextList->Add(context);
    }